

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTextImpl.cpp
# Opt level: O0

DOMText * __thiscall xercesc_4_0::DOMTextImpl::replaceWholeText(DOMTextImpl *this,XMLCh *newText)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  long *plVar6;
  DOMTextImpl *pDVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  DOMException *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNodeImpl *this_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar11;
  undefined4 extraout_var_03;
  MemoryManager *local_c8;
  DOMDocumentImpl *local_b8;
  long local_a8;
  MemoryManager *local_98;
  DOMNode *local_70;
  DOMText *retVal;
  short nodeType;
  DOMTreeWalker *pInnerWalker;
  DOMNode *nextNode;
  DOMNode *pCurrentNode;
  DOMNode *prevNode;
  DOMNode *pFirstTextNode;
  DOMTreeWalker *pWalker;
  DOMDocument *doc;
  XMLCh *newText_local;
  DOMTextImpl *this_local;
  long *plVar4;
  
  iVar3 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  uVar5 = (**(code **)(*plVar4 + 0x68))();
  plVar6 = (long *)(**(code **)(plVar4[2] + 0x18))(plVar4 + 2,uVar5,0xffff,0,1);
  (**(code **)(*plVar6 + 0x70))(plVar6,this);
  pDVar7 = this;
  do {
    prevNode = (DOMNode *)pDVar7;
    pDVar7 = (DOMTextImpl *)(**(code **)(*plVar6 + 0x60))();
    if (((pDVar7 == (DOMTextImpl *)0x0) ||
        (iVar3 = (*((DOMNode *)pDVar7)->_vptr_DOMNode[4])(), iVar3 == 1)) ||
       (iVar3 = (*((DOMNode *)pDVar7)->_vptr_DOMNode[4])(), iVar3 == 8)) break;
    iVar3 = (*((DOMNode *)pDVar7)->_vptr_DOMNode[4])();
  } while (iVar3 != 7);
  uVar5 = (**(code **)(*plVar6 + 0x30))();
  do {
    do {
      plVar8 = (long *)(**(code **)(*plVar6 + 0x68))();
      if (((plVar8 == (long *)0x0) || (iVar3 = (**(code **)(*plVar8 + 0x20))(), iVar3 == 1)) ||
         ((iVar3 = (**(code **)(*plVar8 + 0x20))(), iVar3 == 8 ||
          (iVar3 = (**(code **)(*plVar8 + 0x20))(), iVar3 == 7)))) {
        local_70 = (DOMNode *)0x0;
        if ((newText != (XMLCh *)0x0) && (*newText != L'\0')) {
          this_01 = xercesc_4_0::castToNodeImpl(prevNode);
          bVar1 = DOMNodeImpl::isReadOnly(this_01);
          if ((bVar1) ||
             ((iVar3 = (*prevNode->_vptr_DOMNode[4])(), iVar3 != 3 &&
              (iVar3 = (*prevNode->_vptr_DOMNode[4])(), iVar3 != 4)))) {
            iVar3 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])()
            ;
            if (iVar3 == 3) {
              local_70 = (DOMNode *)(**(code **)(*plVar4 + 0x28))(plVar4,newText);
            }
            else {
              local_70 = (DOMNode *)(**(code **)(*plVar4 + 0x38))(plVar4,newText);
            }
            iVar3 = (*prevNode->_vptr_DOMNode[5])();
            (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x70))
                      ((long *)CONCAT44(extraout_var_02,iVar3),local_70,prevNode);
          }
          else {
            (*prevNode->_vptr_DOMNode[0x13])(prevNode,newText);
            local_70 = prevNode;
          }
        }
        (**(code **)(*plVar6 + 0x70))(plVar6,uVar5);
        while ((((pDVar11 = (DOMNode *)(**(code **)(*plVar6 + 0x68))(), pDVar11 != (DOMNode *)0x0 &&
                 (iVar3 = (*(((DOMCharacterData *)&pDVar11->_vptr_DOMNode)->super_DOMNode).
                            _vptr_DOMNode[4])(), iVar3 != 1)) &&
                (iVar3 = (*(((DOMCharacterData *)&pDVar11->_vptr_DOMNode)->super_DOMNode).
                           _vptr_DOMNode[4])(), iVar3 != 8)) &&
               (iVar3 = (*(((DOMCharacterData *)&pDVar11->_vptr_DOMNode)->super_DOMNode).
                          _vptr_DOMNode[4])(), iVar3 != 7))) {
          if (pDVar11 != local_70) {
            (**(code **)(*plVar6 + 0x60))();
            iVar3 = (*(((DOMCharacterData *)&pDVar11->_vptr_DOMNode)->super_DOMNode)._vptr_DOMNode
                      [5])();
            (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x80))
                      ((long *)CONCAT44(extraout_var_03,iVar3),pDVar11);
            (*(((DOMCharacterData *)&pDVar11->_vptr_DOMNode)->super_DOMNode)._vptr_DOMNode[0x27])();
          }
        }
        (**(code **)(*plVar6 + 0x78))();
        return (DOMText *)local_70;
      }
      iVar3 = (**(code **)(*plVar8 + 0x20))();
    } while (iVar3 != 5);
    plVar8 = (long *)(**(code **)(plVar4[2] + 0x18))(plVar4 + 2,plVar8,0xffff,0,1);
    while (lVar9 = (**(code **)(*plVar8 + 0x68))(), lVar9 != 0) {
      plVar10 = (long *)(**(code **)(*plVar8 + 0x30))();
      sVar2 = (**(code **)(*plVar10 + 0x20))();
      if (((sVar2 != 5) && (sVar2 != 3)) && (sVar2 != 4)) {
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMTextImpl *)0x0) {
          local_98 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])()
          ;
          if (CONCAT44(extraout_var_00,iVar3) == 0) {
            local_a8 = 0;
          }
          else {
            local_a8 = CONCAT44(extraout_var_00,iVar3) + -8;
          }
          if (local_a8 == 0) {
            local_c8 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                              ();
            if (CONCAT44(extraout_var_01,iVar3) == 0) {
              local_b8 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_b8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_01,iVar3) + -8);
            }
            local_c8 = DOMDocumentImpl::getMemoryManager(local_b8);
          }
          local_98 = local_c8;
        }
        DOMException::DOMException(this_00,7,0,local_98);
        __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    (**(code **)(*plVar8 + 0x78))();
  } while( true );
}

Assistant:

DOMText* DOMTextImpl::replaceWholeText(const XMLCh* newText)
{
    DOMDocument *doc = getOwnerDocument();
    DOMTreeWalker* pWalker=doc->createTreeWalker(doc->getDocumentElement(), DOMNodeFilter::SHOW_ALL, NULL, true);
    pWalker->setCurrentNode((DOMNode*)this);
    // Logically-adjacent text nodes are Text or CDATASection nodes that can be visited sequentially in document order or in
    // reversed document order without entering, exiting, or passing over Element, Comment, or ProcessingInstruction nodes.
    DOMNode* pFirstTextNode=this;
    DOMNode* prevNode;
    while((prevNode=pWalker->previousNode())!=NULL)
    {
        if(prevNode->getNodeType()==ELEMENT_NODE || prevNode->getNodeType()==COMMENT_NODE || prevNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        pFirstTextNode=prevNode;
    }
    // before doing any change we need to check if we are going to remove an entity reference that doesn't contain just text
    DOMNode* pCurrentNode=pWalker->getCurrentNode();
    DOMNode* nextNode;
    while((nextNode=pWalker->nextNode())!=NULL)
    {
        if(nextNode->getNodeType()==ELEMENT_NODE || nextNode->getNodeType()==COMMENT_NODE || nextNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        if(nextNode->getNodeType()==ENTITY_REFERENCE_NODE)
        {
            DOMTreeWalker* pInnerWalker=doc->createTreeWalker(nextNode, DOMNodeFilter::SHOW_ALL, NULL, true);
            while(pInnerWalker->nextNode())
            {
                short nodeType=pInnerWalker->getCurrentNode()->getNodeType();
                if(nodeType!=ENTITY_REFERENCE_NODE && nodeType!=TEXT_NODE && nodeType!=CDATA_SECTION_NODE)
                    throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
            }
            pInnerWalker->release();
        }
    }
    DOMText* retVal=NULL;
    // if the first node in the chain is a text node, replace its content, otherwise create a new node
    if(newText && *newText)
    {
        if(!castToNodeImpl(pFirstTextNode)->isReadOnly() && (pFirstTextNode->getNodeType()==TEXT_NODE || pFirstTextNode->getNodeType()==CDATA_SECTION_NODE))
        {
            pFirstTextNode->setNodeValue(newText);
            retVal=(DOMText*)pFirstTextNode;
        }
        else
        {
            if(getNodeType()==TEXT_NODE)
                retVal=doc->createTextNode(newText);
            else
                retVal=doc->createCDATASection(newText);
            pFirstTextNode->getParentNode()->insertBefore(retVal, pFirstTextNode);
        }
    }
    // now delete all the following text nodes
    pWalker->setCurrentNode(pCurrentNode);
    while((nextNode=pWalker->nextNode())!=NULL)
    {
        if(nextNode->getNodeType()==ELEMENT_NODE || nextNode->getNodeType()==COMMENT_NODE || nextNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        if(nextNode!=retVal)
        {
            // keep the tree walker valid
            pWalker->previousNode();
            nextNode->getParentNode()->removeChild(nextNode);
            nextNode->release();
        }
    }
    pWalker->release();
    return retVal;
}